

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

void Abc_Tt7IsopCover(word *uOn,word *uOnDc,int nVars,word *uRes,int *pCover,int *pnCubes)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  word wVar5;
  word wVar6;
  word wVar7;
  ulong uVar8;
  undefined4 in_register_00000014;
  word *pwVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  pwVar9 = (word *)CONCAT44(in_register_00000014,nVars);
  wVar5 = *uOn;
  if ((wVar5 == uOn[1]) && (*uOnDc == uOnDc[1])) {
    wVar5 = Abc_Tt6IsopCover(wVar5,*uOnDc,6,(int *)uRes,pCover);
    pwVar9[1] = wVar5;
    *pwVar9 = wVar5;
  }
  else {
    iVar2 = *pCover;
    lVar11 = (long)iVar2;
    wVar5 = Abc_Tt6IsopCover(wVar5 & ~uOnDc[1],*uOnDc,6,(int *)uRes,pCover);
    iVar3 = *pCover;
    lVar12 = (long)iVar3;
    wVar6 = Abc_Tt6IsopCover(~*uOnDc & uOn[1],uOnDc[1],6,(int *)uRes,pCover);
    iVar4 = *pCover;
    wVar7 = Abc_Tt6IsopCover(~wVar6 & uOn[1] | ~wVar5 & *uOn,uOnDc[1] & *uOnDc,6,(int *)uRes,pCover)
    ;
    uVar10 = wVar5 | wVar7;
    *pwVar9 = uVar10;
    uVar8 = wVar7 | wVar6;
    pwVar9[1] = uVar8;
    if (iVar2 < iVar3) {
      do {
        pbVar1 = (byte *)((long)uRes + lVar11 * 4 + 1);
        *pbVar1 = *pbVar1 | 0x10;
        lVar11 = lVar11 + 1;
      } while (lVar12 != lVar11);
    }
    if (iVar3 < iVar4) {
      do {
        pbVar1 = (byte *)((long)uRes + lVar12 * 4 + 1);
        *pbVar1 = *pbVar1 | 0x20;
        lVar12 = lVar12 + 1;
      } while (iVar4 != lVar12);
    }
    if (((*uOn & ~uVar10) != 0) || ((uOn[1] & ~uVar8) != 0)) {
      __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x89e,"void Abc_Tt7IsopCover(word *, word *, int, word *, int *, int *)");
    }
    if (((uVar10 & ~*uOnDc) != 0) || ((uVar8 & ~uOnDc[1]) != 0)) {
      __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x89f,"void Abc_Tt7IsopCover(word *, word *, int, word *, int *, int *)");
    }
  }
  return;
}

Assistant:

static inline void Abc_Tt7IsopCover( word uOn[2], word uOnDc[2], int nVars, word uRes[2], int * pCover, int * pnCubes )
{
    if ( nVars <= 6 || (uOn[0] == uOn[1] && uOnDc[0] == uOnDc[1]) )
        uRes[0] = uRes[1] = Abc_Tt6IsopCover( uOn[0], uOnDc[0], Abc_MinInt(nVars, 6), pCover, pnCubes );
    else
    {
        word uRes0, uRes1, uRes2;
        int c, nBeg0, nEnd0, nEnd1;
        assert( nVars == 7 );
        // solve for cofactors
        nBeg0 = *pnCubes; 
        uRes0 = Abc_Tt6IsopCover( uOn[0] & ~uOnDc[1], uOnDc[0], 6, pCover, pnCubes );   
        nEnd0 = *pnCubes;
        uRes1 = Abc_Tt6IsopCover( uOn[1] & ~uOnDc[0], uOnDc[1], 6, pCover, pnCubes );   
        nEnd1 = *pnCubes;
        uRes2 = Abc_Tt6IsopCover( (uOn[0] & ~uRes0) | (uOn[1] & ~uRes1), uOnDc[0] & uOnDc[1], 6, pCover, pnCubes );
        // derive the final truth table
        uRes[0] = uRes2 | uRes0;
        uRes[1] = uRes2 | uRes1;
        for ( c = nBeg0; c < nEnd0; c++ )
            pCover[c] |= (1 << (2*6+0));
        for ( c = nEnd0; c < nEnd1; c++ )
            pCover[c] |= (1 << (2*6+1));
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 );
    }
}